

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O2

int configConv(mpt_convertable *val,uintptr_t type,void *ptr)

{
  int iVar1;
  uint8_t *puVar2;
  
  if (type == 0x85) {
    if (ptr == (void *)0x0) {
      return 9;
    }
    puVar2 = (uint8_t *)(val + 1);
    iVar1 = 9;
  }
  else if (type == 9) {
    if (val[4]._vptr == (_mpt_vptr_convertable *)0x0) {
      return -2;
    }
    if (ptr == (void *)0x0) {
      return 0x85;
    }
    puVar2 = (uint8_t *)make_global((mpt_path *)(val + 2));
    iVar1 = 0x85;
  }
  else {
    if (type != 0) {
      return -3;
    }
    if (ptr == (void *)0x0) {
      return 0x85;
    }
    iVar1 = 0;
    puVar2 = configConv::fmt;
  }
  *(uint8_t **)ptr = puVar2;
  return iVar1;
}

Assistant:

static int configConv(MPT_INTERFACE(convertable) *val, uintptr_t type, void *ptr)
{
	const MPT_STRUCT(configRoot) *c = (void *) val;
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeConfigPtr), MPT_ENUM(TypeNodePtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeConfigPtr);
	}
	if (type == MPT_ENUM(TypeConfigPtr)) {
		if (ptr) *((const void **) ptr) = &c->_cfg;
		return MPT_ENUM(TypeNodePtr);
	}
	if (type == MPT_ENUM(TypeNodePtr)) {
		if (!c->base.len) {
			return MPT_ERROR(BadValue);
		}
		if (ptr) {
			*((void **) ptr) = make_global(&c->base);
		}
		return MPT_ENUM(TypeConfigPtr);
	}
	return MPT_ERROR(BadType);
}